

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void __thiscall Rml::DataParser::Emit(DataParser *this,Instruction instruction,Variant *data)

{
  code *pcVar1;
  bool bVar2;
  value_type local_50;
  Variant *local_20;
  Variant *data_local;
  DataParser *pDStack_10;
  Instruction instruction_local;
  DataParser *this_local;
  
  local_20 = data;
  data_local._4_4_ = instruction;
  pDStack_10 = this;
  if (((((instruction == Push) || (instruction == Pop)) || (instruction == NumArguments)) ||
      (((instruction == TransformFnc || (instruction == EventFnc)) ||
       ((instruction == Variable || (instruction == Assign)))))) &&
     (bVar2 = Assert("Use Push(), Pop(), Function(), Variable(), and Assign() procedures for stack manipulation and variable instructions."
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                     ,0xdf), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_50.instruction = data_local._4_4_;
  Variant::Variant(&local_50.data,data);
  ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::push_back
            (&this->program,&local_50);
  InstructionData::~InstructionData(&local_50);
  return;
}

Assistant:

void Emit(Instruction instruction, Variant data = Variant())
	{
		RMLUI_ASSERTMSG(instruction != Instruction::Push && instruction != Instruction::Pop && instruction != Instruction::NumArguments &&
				instruction != Instruction::TransformFnc && instruction != Instruction::EventFnc && instruction != Instruction::Variable &&
				instruction != Instruction::Assign,
			"Use Push(), Pop(), Function(), Variable(), and Assign() procedures for stack manipulation and variable instructions.");

		program.push_back(InstructionData{instruction, std::move(data)});
	}